

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O0

WeightLitsRep * Clasp::WeightLitsRep::create(Solver *s,WeightLitVec *lits,weight_t bound)

{
  bool bVar1;
  ValueRep VVar2;
  uint32 uVar3;
  uint32 uVar4;
  size_type sVar5;
  int iVar6;
  size_type sVar7;
  pair<Clasp::Literal,_int> *this;
  reference ppVar8;
  Literal *pLVar9;
  reference ppVar10;
  int *piVar11;
  iterator op1;
  iterator __last;
  int in_ECX;
  ulong uVar12;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *in_RDX;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *in_RSI;
  WeightLitsRep *in_RDI;
  size_type i_2;
  size_type i_1;
  weight_t B;
  weight_t maxW;
  weight_t minW;
  weight_t sumW;
  Literal x;
  size_type i;
  weight_t MAX_W;
  size_type other;
  size_type j;
  select2nd<std::pair<Clasp::Literal,_int>_> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  Solver *in_stack_fffffffffffffec8;
  Solver *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *in_stack_fffffffffffffee0;
  bool local_c9;
  bool local_c1;
  size_type local_68;
  size_type local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint32 local_40;
  uint32 local_3c;
  uint32 local_38;
  uint32 local_34;
  uint32 local_30;
  uint32 local_2c;
  Literal local_28;
  size_type local_24;
  undefined4 local_20;
  size_type local_1c;
  size_type local_18;
  int local_14;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *local_10;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *local_8;
  
  local_14 = in_ECX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  uVar3 = Solver::numProblemVars((Solver *)0x214abb);
  uVar4 = Solver::numVars((Solver *)0x214acf);
  if ((uVar4 < uVar3) &&
     (bVar1 = bk_lib::
              pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
              ::empty(local_10), !bVar1)) {
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    begin(local_10);
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    end(local_10);
    this = std::max_element<std::pair<Clasp::Literal,int>*>
                     ((pair<Clasp::Literal,_int> *)in_stack_fffffffffffffed0,
                      (pair<Clasp::Literal,_int> *)in_stack_fffffffffffffec8);
    Literal::var(&this->first);
    Solver::acquireProblemVar
              (in_stack_fffffffffffffed0,(Var)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  }
  local_18 = 0;
  local_20 = 0x7fffffff;
  local_24 = 0;
  do {
    sVar7 = local_24;
    sVar5 = bk_lib::
            pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
            ::size(local_10);
    if (sVar7 == sVar5) {
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      begin(local_10);
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      end(local_10);
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      erase(in_stack_fffffffffffffee0,
            (iterator)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
            (iterator)in_stack_fffffffffffffed0);
      local_44 = 0;
      local_48 = 0x7fffffff;
      local_4c = 1;
      local_54 = 1;
      piVar11 = std::max<int>(&local_14,&local_54);
      local_50 = *piVar11;
      local_58 = 0;
      while( true ) {
        sVar7 = bk_lib::
                pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                ::size(local_10);
        if (local_58 == sVar7) {
          if (local_4c == local_48) {
            if (local_48 != 1) {
              local_14 = (local_14 + local_48 + -1) / local_48;
              local_44 = (local_44 + local_48 + -1) / local_48;
              local_68 = 0;
              while (sVar7 = local_68,
                    sVar5 = bk_lib::
                            pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                            ::size(local_10), sVar7 != sVar5) {
                ppVar8 = bk_lib::
                         pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                         ::operator[](local_10,local_68);
                ppVar8->second = 1;
                local_68 = local_68 + 1;
              }
            }
          }
          else {
            op1 = bk_lib::
                  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                  ::begin(local_10);
            __last = bk_lib::
                     pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                     ::end(local_10);
            compose22<std::greater<int>,Clasp::select2nd<std::pair<Clasp::Literal,int>>,Clasp::select2nd<std::pair<Clasp::Literal,int>>>
                      ((greater<int> *)op1,
                       (select2nd<std::pair<Clasp::Literal,_int>_> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffeb8);
            std::
            stable_sort<std::pair<Clasp::Literal,int>*,Clasp::compose_2_2<std::greater<int>,Clasp::select2nd<std::pair<Clasp::Literal,int>>,Clasp::select2nd<std::pair<Clasp::Literal,int>>>>
                      ((pair<Clasp::Literal,_int> *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),__last,
                       SUB83((ulong)in_stack_fffffffffffffee0 >> 0x28,0));
          }
          bVar1 = bk_lib::
                  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                  ::empty(local_10);
          if (bVar1) {
            ppVar8 = (reference)0x0;
          }
          else {
            ppVar8 = bk_lib::
                     pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                     ::operator[](local_10,0);
          }
          in_RDI->lits = ppVar8;
          sVar7 = bk_lib::
                  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                  ::size(local_10);
          in_RDI->size = sVar7;
          in_RDI->bound = local_14;
          in_RDI->reach = local_44;
          return in_RDI;
        }
        in_stack_fffffffffffffee0 = local_8;
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_58);
        Literal::var(&ppVar8->first);
        Solver::clearSeen((Solver *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          (Var)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_58);
        if (local_4c < ppVar8->second) {
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_58);
          piVar11 = std::min<int>(&ppVar8->second,&local_50);
          in_stack_fffffffffffffedc = *piVar11;
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_58);
          ppVar8->second = in_stack_fffffffffffffedc;
          local_4c = in_stack_fffffffffffffedc;
        }
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_58);
        if (ppVar8->second < local_48) {
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_58);
          local_48 = ppVar8->second;
        }
        in_stack_fffffffffffffed8 = 0x7fffffff - local_44;
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_58);
        if (in_stack_fffffffffffffed8 < ppVar8->second) break;
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_58);
        local_44 = ppVar8->second + local_44;
        local_58 = local_58 + 1;
      }
      Potassco::fail(0x4b,
                     "static WeightLitsRep Clasp::WeightLitsRep::create(Solver &, WeightLitVec &, weight_t)"
                     ,0x62,"(MAX_W - sumW) >= lits[i].second","Sum of weights out of range",0);
    }
    ppVar8 = bk_lib::
             pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
             ::operator[](local_10,local_24);
    pLVar9 = Literal::unflag(&ppVar8->first);
    local_28.rep_ = pLVar9->rep_;
    ppVar8 = bk_lib::
             pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
             ::operator[](local_10,local_24);
    if (ppVar8->second == 0) {
LAB_00215190:
      local_40 = local_28.rep_;
      bVar1 = Solver::isTrue(in_stack_fffffffffffffec8,
                             (Literal)(uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      if (bVar1) {
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_24);
        local_14 = local_14 - ppVar8->second;
      }
    }
    else {
      Literal::var(&local_28);
      VVar2 = Solver::topValue(in_stack_fffffffffffffed0,
                               (Var)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      if (VVar2 != '\0') goto LAB_00215190;
      ppVar8 = bk_lib::
               pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
               ::operator[](local_10,local_24);
      if (ppVar8->second < 0) {
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_24);
        iVar6 = ppVar8->second;
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_24);
        ppVar8->second = -iVar6;
        bk_lib::
        pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
        ::operator[](local_10,local_24);
        local_2c = (uint32)Literal::operator~((Literal *)in_stack_fffffffffffffeb8);
        local_28 = (Literal)local_2c;
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_24);
        (ppVar8->first).rep_ = local_28.rep_;
        if ((-1 < local_14) &&
           (iVar6 = 0x7fffffff - local_14,
           ppVar8 = bk_lib::
                    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                    ::operator[](local_10,local_24), iVar6 < ppVar8->second)) {
          Potassco::fail(-2,
                         "static WeightLitsRep Clasp::WeightLitsRep::create(Solver &, WeightLitVec &, weight_t)"
                         ,0x38,"bound < 0 || (MAX_W-bound) >= lits[i].second","bound out of range",0
                        );
        }
        ppVar8 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](local_10,local_24);
        local_14 = ppVar8->second + local_14;
      }
      Literal::var(&local_28);
      bVar1 = Solver::seen((Solver *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           (Var)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      if (bVar1) {
        local_34 = (uint32)Literal::operator~((Literal *)in_stack_fffffffffffffeb8);
        bVar1 = Solver::seen(in_stack_fffffffffffffec8,
                             (Literal)(uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_1c = 0;
          while( true ) {
            local_c9 = false;
            if (local_1c != local_18) {
              bk_lib::
              pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
              ::operator[](local_10,local_1c);
              local_38 = (uint32)Literal::operator~((Literal *)in_stack_fffffffffffffeb8);
              local_c9 = Clasp::operator!=((Literal *)
                                           CONCAT44(in_stack_fffffffffffffec4,
                                                    in_stack_fffffffffffffec0),
                                           (Literal *)in_stack_fffffffffffffeb8);
            }
            if (local_c9 == false) break;
            local_1c = local_1c + 1;
          }
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_24);
          local_14 = local_14 - ppVar8->second;
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_24);
          iVar6 = ppVar8->second;
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_1c);
          ppVar8->second = ppVar8->second - iVar6;
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_1c);
          if (ppVar8->second < 0) {
            ppVar8 = bk_lib::
                     pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                     ::operator[](local_10,local_1c);
            (ppVar8->first).rep_ = local_28.rep_;
            ppVar8 = bk_lib::
                     pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                     ::operator[](local_10,local_1c);
            iVar6 = ppVar8->second;
            ppVar8 = bk_lib::
                     pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                     ::operator[](local_10,local_1c);
            ppVar8->second = -iVar6;
            Literal::var(&local_28);
            Solver::clearSeen((Solver *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (Var)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
            local_3c = local_28.rep_;
            Solver::markSeen(in_stack_fffffffffffffec8,
                             (Literal)(uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20));
            ppVar8 = bk_lib::
                     pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                     ::operator[](local_10,local_1c);
            local_14 = ppVar8->second + local_14;
          }
          else {
            ppVar8 = bk_lib::
                     pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                     ::operator[](local_10,local_1c);
            if (ppVar8->second == 0) {
              Literal::var(&local_28);
              Solver::clearSeen((Solver *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (Var)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
              ppVar8 = bk_lib::
                       pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                       ::operator[](local_10,0);
              uVar12 = (ulong)local_1c;
              ppVar10 = bk_lib::
                        pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                        ::operator[](local_10,0);
              memmove(ppVar8 + uVar12,ppVar10 + (ulong)local_1c + 1,
                      (ulong)((local_18 - local_1c) - 1) << 3);
              local_18 = local_18 - 1;
            }
          }
        }
        else {
          local_1c = 0;
          while( true ) {
            local_c1 = false;
            if (local_1c != local_18) {
              bk_lib::
              pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
              ::operator[](local_10,local_1c);
              local_c1 = Clasp::operator!=((Literal *)
                                           CONCAT44(in_stack_fffffffffffffec4,
                                                    in_stack_fffffffffffffec0),
                                           (Literal *)in_stack_fffffffffffffeb8);
            }
            if (local_c1 == false) break;
            local_1c = local_1c + 1;
          }
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_24);
          iVar6 = ppVar8->second;
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_1c);
          ppVar8->second = iVar6 + ppVar8->second;
        }
      }
      else {
        if (local_24 != local_18) {
          ppVar8 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](local_10,local_24);
          ppVar10 = bk_lib::
                    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                    ::operator[](local_10,local_18);
          std::pair<Clasp::Literal,_int>::operator=(ppVar10,ppVar8);
        }
        local_30 = local_28.rep_;
        Solver::markSeen(in_stack_fffffffffffffec8,
                         (Literal)(uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        local_18 = local_18 + 1;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

WeightLitsRep WeightLitsRep::create(Solver& s, WeightLitVec& lits, weight_t bound) {
	// Step 0: Ensure s has all relevant problem variables
	if (s.numProblemVars() > s.numVars() && !lits.empty()) {
		s.acquireProblemVar(std::max_element(lits.begin(), lits.end())->first.var());
	}
	// Step 1: remove assigned/superfluous literals and merge duplicate/complementary ones
	LitVec::size_type j = 0, other;
	const weight_t MAX_W= std::numeric_limits<weight_t>::max();
	for (LitVec::size_type i = 0; i != lits.size(); ++i) {
		Literal x = lits[i].first.unflag();
		if (lits[i].second != 0 && s.topValue(x.var()) == value_free) {
			if (lits[i].second < 0) {
				lits[i].second = -lits[i].second;
				lits[i].first  = x = ~lits[i].first;
				POTASSCO_REQUIRE(bound < 0 || (MAX_W-bound) >= lits[i].second, "bound out of range");
				bound         += lits[i].second;
			}
			if (!s.seen(x.var())) { // first time we see x, keep and mark x
				if (i != j) lits[j] = lits[i];
				s.markSeen(x);
				++j;
			}
			else if (!s.seen(~x)) { // multi-occurrences of x, merge
				for (other = 0; other != j && lits[other].first != x; ++other) { ; }
				lits[other].second += lits[i].second;
			}
			else {                  // complementary literals ~x x
				for (other = 0; other != j && lits[other].first != ~x; ++other) { ; }
				bound              -= lits[i].second; // decrease by min(w(~x), w(x)) ; assume w(~x) > w(x)
				lits[other].second -= lits[i].second; // keep ~x,
				if (lits[other].second < 0) {         // actually, w(x) > w(~x),
					lits[other].first  = x;             // replace ~x with x
					lits[other].second = -lits[other].second;
					s.clearSeen(x.var());
					s.markSeen(x);
					bound += lits[other].second;        // and correct the bound
				}
				else if (lits[other].second == 0) {   // w(~x) == w(x) - drop both lits
					s.clearSeen(x.var());
					std::memmove(&lits[0]+other, &lits[0]+other+1, (j-other-1)*sizeof(lits[other]));
					--j;
				}
			}
		}
		else if (s.isTrue(x)) { bound -= lits[i].second; }
	}
	lits.erase(lits.begin()+j, lits.end());
	// Step 2: compute min,max, achievable weight and clear flags set in step 1
	weight_t sumW = 0;
	weight_t minW = MAX_W, maxW = 1;
	weight_t B    = std::max(bound, 1);
	for (LitVec::size_type i = 0; i != lits.size(); ++i) {
		assert(lits[i].second > 0);
		s.clearSeen(lits[i].first.var());
		if (lits[i].second > maxW) { maxW = lits[i].second = std::min(lits[i].second, B);  }
		if (lits[i].second < minW) { minW = lits[i].second; }
		POTASSCO_CHECK((MAX_W - sumW) >= lits[i].second, EOVERFLOW, "Sum of weights out of range");
		sumW += lits[i].second;
	}
	// Step 3: sort by decreasing weight
	if (maxW != minW) {
		std::stable_sort(lits.begin(), lits.end(), compose22(
			std::greater<weight_t>(),
			select2nd<WeightLiteral>(),
			select2nd<WeightLiteral>()));
	}
	else if (minW != 1) {
		// disguised cardinality constraint
		bound = (bound+(minW-1))/minW;
		sumW  = (sumW+(minW-1))/minW;
		for (LitVec::size_type i = 0; i != lits.size(); ++i) { lits[i].second = 1; }
	}
	WeightLitsRep result = { !lits.empty() ? &lits[0] : 0, (uint32)lits.size(), bound, sumW };
	return result;
}